

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestStart(StreamingListener *this,TestInfo *test_info)

{
  char *pcVar1;
  string *in_RDI;
  StreamingListener *unaff_retaddr;
  char local_40 [16];
  string local_30 [8];
  String *in_stack_ffffffffffffffd8;
  string *message;
  
  message = in_RDI;
  pcVar1 = TestInfo::name((TestInfo *)0x206b02);
  String::Format(local_40,"event=TestStart&name=%s\n",pcVar1);
  String::operator_cast_to_string(in_stack_ffffffffffffffd8);
  Send(unaff_retaddr,message);
  std::__cxx11::string::~string(local_30);
  String::~String((String *)in_RDI);
  return;
}

Assistant:

void OnTestStart(const TestInfo& test_info) {
    Send(String::Format("event=TestStart&name=%s\n", test_info.name()));
  }